

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

void P_DaggerAlert(AActor *target,AActor *emitter)

{
  sector_t *ent;
  AActor *this;
  bool bVar1;
  uint uVar2;
  int iVar3;
  FSoundID local_4c;
  TFlags<ActorFlag4,_unsigned_int> local_48;
  TFlags<ActorFlag4,_unsigned_int> local_44;
  FName local_40;
  FName local_3c;
  FState *local_38;
  FState *painstate;
  sector_t *local_28;
  sector_t *sec;
  AActor *looker;
  AActor *emitter_local;
  AActor *target_local;
  
  local_28 = emitter->Sector;
  looker = emitter;
  emitter_local = target;
  bVar1 = TObjPtr<AActor>::operator!=(&emitter->LastHeard,(AActor *)0x0);
  if ((!bVar1) && (0 < looker->health)) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&painstate + 4),
               (int)looker + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&painstate + 4));
    if (uVar2 != 0) {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                ((TFlags<ActorFlag4,_unsigned_int> *)&painstate,
                 (int)looker + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
                );
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&painstate);
      if (uVar2 == 0) {
        TFlags<ActorFlag4,_unsigned_int>::operator|=(&looker->flags4,MF4_INCOMBAT);
        TObjPtr<AActor>::operator=(&looker->target,emitter_local);
        this = looker;
        FName::FName(&local_3c,NAME_Pain);
        FName::FName(&local_40,NAME_Dagger);
        local_38 = AActor::FindState(this,&local_3c,&local_40,false);
        if (local_38 != (FState *)0x0) {
          AActor::SetState(looker,local_38,false);
        }
        for (sec = (sector_t *)local_28->thinglist; sec != (sector_t *)0x0;
            sec = *(sector_t **)&sec->planes[0].Flags) {
          if ((((AActor *)sec != looker) && ((AActor *)sec != emitter_local)) &&
             (0 < *(int *)((long)&(sec->SecActTarget).field_0 + 4))) {
            TFlags<ActorFlag4,_unsigned_int>::operator&
                      (&local_44,
                       (int)sec +
                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
            uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
            if (uVar2 != 0) {
              TFlags<ActorFlag4,_unsigned_int>::operator&
                        (&local_48,
                         (int)sec +
                         (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
              uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
              if ((uVar2 == 0) &&
                 ((bVar1 = P_CheckSight((AActor *)sec,emitter_local,0), bVar1 ||
                  (bVar1 = P_CheckSight((AActor *)sec,looker,0), bVar1)))) {
                TObjPtr<AActor>::operator=((TObjPtr<AActor> *)&sec->PortalGroup,emitter_local);
                iVar3 = FSoundID::operator_cast_to_int((FSoundID *)((long)&sec[1].heightsec + 4));
                ent = sec;
                if (iVar3 != 0) {
                  FSoundID::FSoundID(&local_4c,(FSoundID *)((long)&sec[1].heightsec + 4));
                  S_Sound((AActor *)ent,2,&local_4c,1.0,1.0);
                }
                AActor::SetState((AActor *)sec,(FState *)sec[2].planes[0].xform.yScale,false);
                TFlags<ActorFlag4,_unsigned_int>::operator|=
                          ((TFlags<ActorFlag4,_unsigned_int> *)&sec->render_thinglist,MF4_INCOMBAT);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void P_DaggerAlert(AActor *target, AActor *emitter)
{
	AActor *looker;
	sector_t *sec = emitter->Sector;

	if (emitter->LastHeard != NULL)
		return;
	if (emitter->health <= 0)
		return;
	if (!(emitter->flags3 & MF3_ISMONSTER))
		return;
	if (emitter->flags4 & MF4_INCOMBAT)
		return;
	emitter->flags4 |= MF4_INCOMBAT;

	emitter->target = target;
	FState *painstate = emitter->FindState(NAME_Pain, NAME_Dagger);
	if (painstate != NULL)
	{
		emitter->SetState(painstate);
	}

	for (looker = sec->thinglist; looker != NULL; looker = looker->snext)
	{
		if (looker == emitter || looker == target)
			continue;

		if (looker->health <= 0)
			continue;

		if (!(looker->flags4 & MF4_SEESDAGGERS))
			continue;

		if (!(looker->flags4 & MF4_INCOMBAT))
		{
			if (!P_CheckSight(looker, target) && !P_CheckSight(looker, emitter))
				continue;

			looker->target = target;
			if (looker->SeeSound)
			{
				S_Sound(looker, CHAN_VOICE, looker->SeeSound, 1, ATTN_NORM);
			}
			looker->SetState(looker->SeeState);
			looker->flags4 |= MF4_INCOMBAT;
		}
	}
}